

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

QRect __thiscall QMenuBarPrivate::menuRect(QMenuBarPrivate *this,bool extVisible)

{
  QWidget *this_00;
  QObject *pQVar1;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  uint uVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  QRect QVar7;
  ulong local_40;
  ulong local_38;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar4 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x21,0,this_00);
  QVar7 = QWidget::rect(this_00);
  uVar6 = QVar7.x1.m_i.m_i + iVar3;
  uVar5 = QVar7.x2.m_i.m_i - iVar3;
  if ((int)CONCAT71(in_register_00000031,extVisible) != 0) {
    bVar2 = QWidget::isRightToLeft(this_00);
    iVar3 = (**(code **)(*(long *)&(this->extension->super_QToolButton).super_QAbstractButton.
                                   super_QWidget + 0x70))();
    if (bVar2) {
      uVar6 = uVar6 + iVar3;
    }
    else {
      uVar5 = uVar5 - iVar3;
    }
  }
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->leftWidget);
  if (bVar2) {
    pQVar1 = (this->leftWidget).wp.value;
    if ((*(byte *)(*(long *)(pQVar1 + 0x20) + 9) & 0x80) != 0) {
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x70))();
      bVar2 = QWidget::isRightToLeft(this_00);
      if (bVar2) {
        uVar5 = uVar5 - iVar3;
      }
      else {
        uVar6 = uVar6 + iVar3;
      }
    }
  }
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this->rightWidget);
  if (bVar2) {
    pQVar1 = (this->rightWidget).wp.value;
    if ((*(byte *)(*(long *)(pQVar1 + 0x20) + 9) & 0x80) != 0) {
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x70))();
      bVar2 = QWidget::isRightToLeft(this_00);
      if (bVar2) {
        uVar6 = uVar6 + iVar3;
      }
      else {
        uVar5 = uVar5 - iVar3;
      }
    }
  }
  local_38 = QVar7._8_8_;
  local_40 = QVar7._0_8_;
  QVar7._0_8_ = (ulong)uVar6 | local_40 & 0xffffffff00000000;
  QVar7._8_8_ = (ulong)uVar5 | local_38 & 0xffffffff00000000;
  return QVar7;
}

Assistant:

QRect QMenuBarPrivate::menuRect(bool extVisible) const
{
    Q_Q(const QMenuBar);

    int hmargin = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    QRect result = q->rect();
    result.adjust(hmargin, 0, -hmargin, 0);

    if (extVisible) {
        if (q->isRightToLeft())
            result.setLeft(result.left() + extension->sizeHint().width());
        else
            result.setWidth(result.width() - extension->sizeHint().width());
    }

    if (leftWidget && leftWidget->isVisible()) {
        QSize sz = leftWidget->sizeHint();
        if (q->isRightToLeft())
            result.setRight(result.right() - sz.width());
        else
            result.setLeft(result.left() + sz.width());
    }

    if (rightWidget && rightWidget->isVisible()) {
        QSize sz = rightWidget->sizeHint();
        if (q->isRightToLeft())
            result.setLeft(result.left() + sz.width());
        else
            result.setRight(result.right() - sz.width());
    }

    return result;
}